

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O3

TreeEnsembleParameters_TreeNode * __thiscall
CoreML::TreeEnsembleBase::_getNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,bool is_setup_routine)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TreeEnsembleParameters *pTVar3;
  Rep *pRVar4;
  _Base_ptr p_Var5;
  Type *pTVar6;
  TreeEnsembleParameters_TreeNode *pTVar7;
  ostream *poVar8;
  logic_error *plVar9;
  _Base_ptr p_Var10;
  const_iterator __position;
  long lVar11;
  _Alloc_node __an;
  ostringstream ss;
  _Alloc_node local_1c8 [4];
  pair<const_std::pair<unsigned_long,_unsigned_long>,_int> local_1a8 [15];
  
  p_Var5 = (this->_nodeId_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->_nodeId_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var10 = &p_Var1->_M_header;
  __position._M_node = &p_Var1->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      if ((*(ulong *)(p_Var5 + 1) < treeId) ||
         ((lVar11 = 0x10, __position._M_node = p_Var5, *(ulong *)(p_Var5 + 1) <= treeId &&
          (p_Var5[1]._M_parent < nodeId)))) {
        lVar11 = 0x18;
        __position._M_node = p_Var10;
      }
      p_Var5 = *(_Base_ptr *)((long)&p_Var5->_M_color + lVar11);
      p_Var10 = __position._M_node;
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)__position._M_node != p_Var1) &&
        (*(size_t *)(__position._M_node + 1) == treeId)) &&
       (__position._M_node[1]._M_parent == (_Base_ptr)nodeId)) {
      if (is_setup_routine) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Setup routine called multiple times for treeId=",0x2f);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", nodeID=",9);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::logic_error::logic_error(plVar9,(string *)local_1c8);
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                         (&(this->tree_parameters->nodes_).super_RepeatedPtrFieldBase,
                          *(int *)&__position._M_node[1]._M_left);
      return pTVar6;
    }
  }
  if (!is_setup_routine) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Setup routine not called yet for node with treeId=",0x32);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", nodeID=",9);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::logic_error::logic_error(plVar9,(string *)local_1c8);
    __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pTVar3 = this->tree_parameters;
  iVar2 = (pTVar3->nodes_).super_RepeatedPtrFieldBase.current_size_;
  pRVar4 = (pTVar3->nodes_).super_RepeatedPtrFieldBase.rep_;
  if ((pRVar4 == (Rep *)0x0) || (pRVar4->allocated_size <= iVar2)) {
    pTVar7 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::TreeEnsembleParameters_TreeNode>
                       ((pTVar3->nodes_).super_RepeatedPtrFieldBase.arena_);
    pTVar7 = (TreeEnsembleParameters_TreeNode *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(pTVar3->nodes_).super_RepeatedPtrFieldBase,pTVar7);
  }
  else {
    (pTVar3->nodes_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
    pTVar7 = (TreeEnsembleParameters_TreeNode *)pRVar4->elements[iVar2];
  }
  pTVar7->treeid_ = treeId;
  pTVar7->nodeid_ = nodeId;
  local_1c8[0]._M_t = &(this->_nodeId_map)._M_t;
  local_1a8[0].first.first = treeId;
  local_1a8[0].first.second = nodeId;
  local_1a8[0].second = iVar2;
  std::
  _Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Select1st<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>,std::less<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>>
  ::
  _M_insert_unique_<std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Select1st<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>,std::less<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>>::_Alloc_node>
            ((_Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Select1st<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>,std::less<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>>
              *)&this->_nodeId_map,__position,local_1a8,local_1c8);
  return pTVar7;
}

Assistant:

Specification::TreeEnsembleParameters_TreeNode& TreeEnsembleBase::_getNode(size_t treeId, size_t nodeId, bool is_setup_routine) {
        auto it = _nodeId_map.lower_bound({treeId, nodeId});

        if(it == _nodeId_map.end() || it->first != std::make_pair(treeId, nodeId)) {
            if(!is_setup_routine) {
                std::ostringstream ss;
                ss << "Setup routine not called yet for node with treeId=" << treeId << ", nodeID=" << nodeId << ".";
                throw std::logic_error(ss.str());
            }

            int new_node_index = tree_parameters->nodes_size();
            Specification::TreeEnsembleParameters_TreeNode* newNode = tree_parameters->add_nodes();
            newNode->set_treeid(treeId);
            newNode->set_nodeid(nodeId);
            _nodeId_map.insert(it, {{treeId, nodeId}, new_node_index});
            return *newNode;
        } else {
            if(is_setup_routine) {
                std::ostringstream ss;
                ss << "Setup routine called multiple times for treeId=" << treeId << ", nodeID=" << nodeId << ".";
                throw std::logic_error(ss.str());
            }
            return *(tree_parameters->mutable_nodes(it->second));
        }
    }